

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

void __thiscall CChain::SetTip(CChain *this,CBlockIndex *block)

{
  long lVar1;
  reference ppCVar2;
  CBlockIndex *in_RSI;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *pindex;
  uint7 in_stack_ffffffffffffffd0;
  bool bVar3;
  value_type pCVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::resize
            ((vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)in_RSI,(size_type)in_RSI);
  while( true ) {
    bVar3 = false;
    if (in_RSI != (CBlockIndex *)0x0) {
      ppCVar2 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::operator[]
                          (in_RDI,(ulong)in_stack_ffffffffffffffd0);
      bVar3 = *ppCVar2 != in_RSI;
    }
    if (bVar3 == false) break;
    pCVar4 = in_RSI;
    ppCVar2 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::operator[]
                        (in_RDI,CONCAT17(bVar3,in_stack_ffffffffffffffd0));
    *ppCVar2 = in_RSI;
    in_RSI = pCVar4->pprev;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChain::SetTip(CBlockIndex& block)
{
    CBlockIndex* pindex = &block;
    vChain.resize(pindex->nHeight + 1);
    while (pindex && vChain[pindex->nHeight] != pindex) {
        vChain[pindex->nHeight] = pindex;
        pindex = pindex->pprev;
    }
}